

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

char * Map_GetValueFromKey(MAP_HANDLE handle,char *key)

{
  LOGGER_LOG p_Var1;
  char **ppcVar2;
  
  if (handle == (MAP_HANDLE)0x0 || key == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                ,"Map_GetValueFromKey",0x22a,1,"invalid parameter to Map_GetValueFromKey");
      return (char *)0x0;
    }
  }
  else {
    ppcVar2 = findKey(handle,key);
    if (ppcVar2 != (char **)0x0) {
      return *(char **)((long)handle->values + ((long)ppcVar2 - (long)handle->keys));
    }
  }
  return (char *)0x0;
}

Assistant:

const char* Map_GetValueFromKey(MAP_HANDLE handle, const char* key)
{
    const char* result;
    /*Codes_SRS_MAP_02_040: [If parameter handle or key is NULL then Map_GetValueFromKey returns NULL.]*/
    if (
        (handle == NULL) ||
        (key == NULL)
        )
    {
        result = NULL;
        LogError("invalid parameter to Map_GetValueFromKey");
    }
    else
    {
        MAP_HANDLE_DATA * handleData = (MAP_HANDLE_DATA *)handle;
        char** whereIsIt = findKey(handleData, key);
        if(whereIsIt == NULL)
        {
            /*Codes_SRS_MAP_02_041: [If the key is not found, then Map_GetValueFromKey returns NULL.]*/
            result = NULL;
        }
        else
        {
            /*Codes_SRS_MAP_02_042: [Otherwise, Map_GetValueFromKey returns the key's value.] */
            size_t index = whereIsIt - handleData->keys;
            result = handleData->values[index];
        }
    }
    return result;
}